

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  int *piVar5;
  float *pfVar6;
  size_t sVar7;
  Allocator *pAVar8;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  float *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_3;
  float *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int elempack_5;
  size_t elemsize_5;
  int channels_1;
  int h_2;
  float *ptr_4;
  int size_3;
  Mat *bottom_blob_9;
  size_t b_9;
  float *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int elempack_4;
  size_t elemsize_4;
  int channels;
  int w_2;
  float *outptr_3;
  float *ptr_3;
  int size_2;
  int i_2;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *r0_1;
  int q;
  int size_1;
  Mat *bottom_blob_7;
  size_t b_7;
  int p;
  Mat top_blob_unpacked_1;
  Mat *top_blob_3;
  size_t out_elemsize_2;
  int out_elempack_2;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int elempack_3;
  size_t elemsize_3;
  int h_1;
  int w_1;
  float *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  float *outptr_2;
  int i_1;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int elempack_2;
  size_t elemsize_2;
  int h;
  float *ptr_1;
  int size;
  int j;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *r0;
  int i;
  Mat *bottom_blob_3;
  size_t b_3;
  float *outptr_1;
  Mat top_blob_unpacked;
  Mat *top_blob_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int elempack_1;
  size_t elemsize_1;
  int w;
  float *ptr;
  Mat *bottom_blob_1;
  size_t b_1;
  float *outptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  int elempack;
  size_t elemsize;
  int positive_axis;
  int dims;
  Mat *in_stack_fffffffffffff888;
  Mat *pMVar9;
  undefined4 in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  size_t in_stack_fffffffffffff898;
  Mat *this_00;
  size_t in_stack_fffffffffffff8a0;
  int _c;
  undefined8 in_stack_fffffffffffff8a8;
  ulong uVar10;
  Mat *in_stack_fffffffffffff8b0;
  Mat *in_stack_fffffffffffff8b8;
  Allocator *in_stack_fffffffffffff8c0;
  Allocator *_allocator;
  Mat *in_stack_fffffffffffff8c8;
  Mat *in_stack_fffffffffffff8d0;
  int local_654;
  Mat local_648;
  float *local_600;
  const_reference local_5f8;
  ulong local_5f0;
  int local_5e4;
  Mat local_5e0;
  Mat *local_598;
  int local_58c;
  reference local_588;
  const_reference local_580;
  Allocator *local_578;
  int local_570;
  int local_56c;
  size_t local_568;
  int local_560;
  int local_55c;
  Mat local_558;
  float *local_510;
  int local_504;
  const_reference local_500;
  ulong local_4f8;
  Mat local_4f0;
  float *local_4a8;
  int local_49c;
  reference local_498;
  const_reference local_490;
  ulong local_488;
  int local_480;
  int local_47c;
  size_t local_478;
  int local_470;
  int local_46c;
  Mat local_468;
  float *local_420;
  float *local_418;
  int local_410;
  int local_40c;
  Mat local_408;
  float *local_3c0;
  Mat local_3b8;
  float *local_370;
  Mat local_368;
  float *local_320;
  Mat local_318;
  float *local_2d0;
  Mat local_2c8;
  float *local_280;
  int local_278;
  int local_274;
  const_reference local_270;
  ulong local_268;
  int local_25c;
  reference local_210;
  long local_208;
  int local_1fc;
  const_reference local_1f8;
  ulong local_1f0;
  int local_1e8;
  int local_1e4;
  size_t local_1e0;
  int local_1d8;
  int local_1d4;
  float *local_1d0;
  const_reference local_1c8;
  ulong local_1c0;
  float *local_1b8;
  int local_1ac;
  reference local_1a8;
  const_reference local_1a0;
  ulong local_198;
  int local_190;
  int local_18c;
  size_t local_188;
  int local_17c;
  float *local_178;
  int local_170;
  int local_16c;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  int local_13c;
  Mat *local_138;
  ulong local_130;
  float *local_128;
  int local_120;
  Mat local_110;
  reference local_c8;
  long local_c0;
  int local_b4;
  const_reference local_b0;
  ulong local_a8;
  int local_a0;
  int local_9c;
  size_t local_98;
  int local_8c;
  float *local_88;
  const_reference local_80;
  ulong local_78;
  float *local_70;
  reference local_68;
  long local_60;
  int local_54;
  const_reference local_50;
  ulong local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  int local_30;
  int local_2c;
  long local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2c = pvVar2->dims;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0) {
    local_654 = local_2c + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  }
  else {
    local_654 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  }
  local_30 = local_654;
  if (local_2c == 1) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_38 = pvVar2->elemsize;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_3c = pvVar2->elempack;
    local_40 = 0;
    for (local_48 = 0; uVar10 = local_48,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_48 = local_48 + 1) {
      local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_48);
      local_40 = local_50->w * local_50->elempack + local_40;
    }
    local_54 = 1;
    if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_54 = 1, local_40 % 4 == 0)) {
      local_54 = 4;
    }
    local_60 = (local_38 / (ulong)(long)local_3c) * (long)local_54;
    local_68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      in_stack_fffffffffffff8a0,(int)(in_stack_fffffffffffff898 >> 0x20),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (bVar1) {
      return -100;
    }
    local_70 = ncnn::Mat::operator_cast_to_float_(local_68);
    for (local_78 = 0; uVar10 = local_78,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_78 = local_78 + 1) {
      local_80 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_78);
      local_88 = ncnn::Mat::operator_cast_to_float_(local_80);
      memcpy(local_70,local_88,(long)local_80->w * local_80->elemsize);
      local_70 = local_70 + local_80->w * local_80->elempack;
    }
  }
  if ((local_2c == 2) && (local_30 == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_8c = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_98 = pvVar2->elemsize;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_9c = pvVar2->elempack;
    local_a0 = 0;
    for (local_a8 = 0; uVar10 = local_a8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_a8 = local_a8 + 1) {
      local_b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_a8);
      puVar4 = std::min<unsigned_long>(&local_98,&local_b0->elemsize);
      local_98 = *puVar4;
      piVar5 = std::min<int>(&local_9c,&local_b0->elempack);
      local_9c = *piVar5;
      local_a0 = local_b0->h * local_b0->elempack + local_a0;
    }
    local_b4 = 1;
    if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_b4 = 1, local_a0 % 4 == 0)) {
      local_b4 = 4;
    }
    local_c0 = (local_98 / (ulong)(long)local_9c) * (long)local_b4;
    local_c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      (int)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                      (int)(in_stack_fffffffffffff898 >> 0x20),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (bVar1) {
      return -100;
    }
    ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                   in_stack_fffffffffffff888);
    if (local_9c < local_b4) {
      ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                        (int)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                        (int)(in_stack_fffffffffffff898 >> 0x20),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890))
      ;
      if (!bVar1) goto LAB_0019243a;
      local_4 = -100;
      local_120 = 1;
    }
    else {
LAB_0019243a:
      local_128 = ncnn::Mat::operator_cast_to_float_(&local_110);
      for (local_130 = 0; uVar10 = local_130,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3
          ; local_130 = local_130 + 1) {
        local_138 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_130);
        if ((local_138->elempack == 4) && (local_9c == 1)) {
          for (local_13c = 0; local_13c < local_138->h; local_13c = local_13c + 1) {
            local_148 = ncnn::Mat::row(local_138,local_13c);
            local_150 = local_128;
            local_168 = local_128 + local_8c * 3;
            local_160 = local_128 + (local_8c << 1);
            local_158 = local_128 + local_8c;
            for (local_16c = 0; local_16c < local_8c; local_16c = local_16c + 1) {
              *local_150 = *local_148;
              *local_158 = local_148[1];
              *local_160 = local_148[2];
              *local_168 = local_148[3];
              local_148 = local_148 + 4;
              local_168 = local_168 + 1;
              local_160 = local_160 + 1;
              local_158 = local_158 + 1;
              local_150 = local_150 + 1;
            }
            local_128 = local_128 + (local_8c << 2);
          }
        }
        if (local_138->elempack == local_9c) {
          local_170 = local_8c * local_138->h;
          local_178 = ncnn::Mat::operator_cast_to_float_(local_138);
          memcpy(local_128,local_178,(long)local_170 * local_138->elemsize);
          local_128 = local_128 + local_170 * local_138->elempack;
        }
      }
      if (local_9c < local_b4) {
        convert_packing(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                        (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                        (Option *)in_stack_fffffffffffff8b8);
      }
      local_120 = 0;
    }
    ncnn::Mat::~Mat((Mat *)0x1927e1);
    if (local_120 != 0) {
      return local_4;
    }
  }
  if ((local_2c == 2) && (local_30 == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_17c = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_188 = pvVar2->elemsize;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_18c = pvVar2->elempack;
    local_190 = 0;
    for (local_198 = 0; uVar10 = local_198,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_198 = local_198 + 1) {
      local_1a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_198)
      ;
      local_190 = local_1a0->w + local_190;
    }
    local_1a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      (int)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                      (int)(in_stack_fffffffffffff898 >> 0x20),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (bVar1) {
      return -100;
    }
    for (local_1ac = 0; local_1ac < local_17c; local_1ac = local_1ac + 1) {
      local_1b8 = ncnn::Mat::row(local_1a8,local_1ac);
      for (local_1c0 = 0; uVar10 = local_1c0,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3
          ; local_1c0 = local_1c0 + 1) {
        local_1c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_1c0);
        local_1d0 = ncnn::Mat::row(local_1c8,local_1ac);
        memcpy(local_1b8,local_1d0,(long)local_1c8->w * local_188);
        local_1b8 = local_1b8 + local_1c8->w * local_18c;
      }
    }
  }
  if ((local_2c != 3) || (local_30 != 0)) goto LAB_001933ca;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_1d4 = pvVar2->w;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_1d8 = pvVar2->h;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_1e0 = pvVar2->elemsize;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_1e4 = pvVar2->elempack;
  local_1e8 = 0;
  for (local_1f0 = 0; uVar10 = local_1f0,
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
      local_1f0 = local_1f0 + 1) {
    local_1f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_1f0);
    puVar4 = std::min<unsigned_long>(&local_1e0,&local_1f8->elemsize);
    local_1e0 = *puVar4;
    piVar5 = std::min<int>(&local_1e4,&local_1f8->elempack);
    local_1e4 = *piVar5;
    local_1e8 = local_1f8->c * local_1f8->elempack + local_1e8;
  }
  local_1fc = 1;
  if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_1fc = 1, local_1e8 % 4 == 0)) {
    local_1fc = 4;
  }
  local_208 = (local_1e0 / (ulong)(long)local_1e4) * (long)local_1fc;
  local_210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  pMVar9 = *(Mat **)(local_28 + 8);
  ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                    (int)in_stack_fffffffffffff8a8,(int)(in_stack_fffffffffffff8a0 >> 0x20),
                    in_stack_fffffffffffff898,in_stack_fffffffffffff894,in_stack_fffffffffffff8c0);
  bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  if (bVar1) {
    return -100;
  }
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),pMVar9);
  if (local_1e4 < local_1fc) {
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      (int)in_stack_fffffffffffff8a8,(int)(in_stack_fffffffffffff8a0 >> 0x20),
                      in_stack_fffffffffffff898,in_stack_fffffffffffff894,in_stack_fffffffffffff8c0)
    ;
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (!bVar1) goto LAB_00192def;
    local_4 = -100;
    local_120 = 1;
  }
  else {
LAB_00192def:
    local_25c = 0;
    for (local_268 = 0; uVar10 = local_268,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_268 = local_268 + 1) {
      local_270 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_268)
      ;
      if ((local_270->elempack == 4) && (local_1e4 == 1)) {
        local_274 = local_270->w * local_270->h;
        for (local_278 = 0; local_278 < local_270->c; local_278 = local_278 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,
                             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_2c8);
          ncnn::Mat::~Mat((Mat *)0x192ef7);
          local_280 = pfVar6;
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,
                             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_318);
          ncnn::Mat::~Mat((Mat *)0x192f49);
          local_2d0 = pfVar6;
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,
                             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_368);
          ncnn::Mat::~Mat((Mat *)0x192f9d);
          local_320 = pfVar6;
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,
                             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_3b8);
          ncnn::Mat::~Mat((Mat *)0x192ff2);
          local_370 = pfVar6;
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,
                             (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_408);
          ncnn::Mat::~Mat((Mat *)0x193047);
          local_3c0 = pfVar6;
          for (local_40c = 0; local_40c < local_274; local_40c = local_40c + 1) {
            *local_2d0 = *local_280;
            *local_320 = local_280[1];
            *local_370 = local_280[2];
            *local_3c0 = local_280[3];
            local_280 = local_280 + 4;
            local_3c0 = local_3c0 + 1;
            local_370 = local_370 + 1;
            local_320 = local_320 + 1;
            local_2d0 = local_2d0 + 1;
          }
          local_25c = local_25c + 4;
        }
      }
      if (local_270->elempack == local_1e4) {
        sVar7 = ncnn::Mat::total(local_270);
        local_410 = (int)sVar7;
        local_418 = ncnn::Mat::operator_cast_to_float_(local_270);
        ncnn::Mat::channel(in_stack_fffffffffffff8b8,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_468);
        ncnn::Mat::~Mat((Mat *)0x1932c4);
        local_420 = pfVar6;
        memcpy(pfVar6,local_418,(long)local_410 * local_270->elemsize);
        local_25c = local_270->c + local_25c;
      }
    }
    if (local_1e4 < local_1fc) {
      convert_packing(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                      (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
                      (Option *)in_stack_fffffffffffff8b8);
    }
    local_120 = 0;
  }
  ncnn::Mat::~Mat((Mat *)0x1933a4);
  if (local_120 != 0) {
    return local_4;
  }
LAB_001933ca:
  if ((local_2c == 3) && (local_30 == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_46c = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_470 = pvVar2->c;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_478 = pvVar2->elemsize;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_47c = pvVar2->elempack;
    local_480 = 0;
    for (local_488 = 0; uVar10 = local_488,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3;
        local_488 = local_488 + 1) {
      local_490 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_488)
      ;
      local_480 = local_490->h + local_480;
    }
    local_498 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      (int)in_stack_fffffffffffff8a8,(int)(in_stack_fffffffffffff8a0 >> 0x20),
                      in_stack_fffffffffffff898,in_stack_fffffffffffff894,in_stack_fffffffffffff8c0)
    ;
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (bVar1) {
      return -100;
    }
    for (local_49c = 0; local_49c < local_470; local_49c = local_49c + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff8b8,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
      pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_4f0);
      ncnn::Mat::~Mat((Mat *)0x1935ba);
      local_4a8 = pfVar6;
      for (local_4f8 = 0; uVar10 = local_4f8,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar10 < sVar3
          ; local_4f8 = local_4f8 + 1) {
        local_500 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_4f8);
        local_504 = local_500->w * local_500->h;
        pMVar9 = &local_558;
        ncnn::Mat::channel(in_stack_fffffffffffff8b8,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(pMVar9);
        ncnn::Mat::~Mat((Mat *)0x193672);
        local_510 = pfVar6;
        memcpy(local_4a8,pfVar6,(long)local_504 * local_478);
        local_4a8 = local_4a8 + local_504 * local_47c;
      }
    }
  }
  if ((local_2c == 3) && (local_30 == 2)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_55c = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_560 = pvVar2->c;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_568 = pvVar2->elemsize;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_56c = pvVar2->elempack;
    local_570 = 0;
    local_578 = (Allocator *)0x0;
    while( true ) {
      _allocator = local_578;
      pAVar8 = (Allocator *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      _c = (int)(in_stack_fffffffffffff8a0 >> 0x20);
      if (pAVar8 <= _allocator) break;
      local_580 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_18,(size_type)local_578);
      local_570 = local_580->w + local_570;
      local_578 = (Allocator *)((long)&local_578->_vptr_Allocator + 1);
    }
    local_588 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                      (int)in_stack_fffffffffffff8a8,_c,in_stack_fffffffffffff898,
                      in_stack_fffffffffffff894,_allocator);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    if (bVar1) {
      return -100;
    }
    for (local_58c = 0; local_58c < local_560; local_58c = local_58c + 1) {
      pMVar9 = &local_5e0;
      ncnn::Mat::channel(in_stack_fffffffffffff8b8,(int)((ulong)pMVar9 >> 0x20));
      in_stack_fffffffffffff8b8 = (Mat *)ncnn::Mat::operator_cast_to_float_(pMVar9);
      ncnn::Mat::~Mat((Mat *)0x19393d);
      local_598 = in_stack_fffffffffffff8b8;
      for (local_5e4 = 0; local_5e4 < local_55c; local_5e4 = local_5e4 + 1) {
        local_5f0 = 0;
        while (uVar10 = local_5f0,
              sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
              uVar10 < sVar3) {
          local_5f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_5f0);
          this_00 = &local_648;
          ncnn::Mat::channel(in_stack_fffffffffffff8b8,(int)((ulong)pMVar9 >> 0x20));
          pfVar6 = ncnn::Mat::row(this_00,local_5e4);
          ncnn::Mat::~Mat((Mat *)0x193a03);
          local_600 = pfVar6;
          memcpy(local_598,pfVar6,(long)local_5f8->w * local_568);
          local_598 = (Mat *)((long)&local_598->data + (long)(local_5f8->w * local_56c) * 4);
          local_5f0 = local_5f0 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}